

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_recv(telnet_t *telnet,char *buffer,size_t size)

{
  byte bVar1;
  short sVar2;
  telnet_state_t tVar3;
  uint uVar4;
  telnet_telopt_t *ptVar5;
  telnet_error_t tVar6;
  telnet_rfc1143_t *ptVar7;
  int *piVar8;
  byte bVar9;
  byte bVar10;
  ushort uVar11;
  uint *puVar12;
  char *func;
  void *pvVar13;
  size_t sVar14;
  uint uVar15;
  uint *puVar16;
  telnet_event_t *ptVar17;
  uint *in_R8;
  char *fmt;
  byte bVar18;
  long lVar19;
  char *in_stack_ffffffffffffff68;
  char acStack_84 [3];
  byte bStack_81;
  telnet_event_t tStack_80;
  telnet_event_t tStack_58;
  
  if (size == 0) {
    size = 0;
    lVar19 = 0;
  }
  else {
    lVar19 = 0;
    sVar14 = 0;
    do {
      bVar9 = buffer[sVar14];
      tVar3 = telnet->state;
      bStack_81 = bVar9;
      if (TELNET_STATE_SB_DATA_IAC < tVar3) goto LAB_00102415;
      uVar15 = (uint)bVar9;
      switch(tVar3) {
      case TELNET_STATE_DATA:
        if (uVar15 == 0xd) {
          if ((telnet->flags & 0x42) == 2) {
            if ((char *)(sVar14 - lVar19) != (char *)0x0) {
              tStack_58.type = TELNET_EV_DATA;
              tStack_58.data.buffer = buffer + lVar19;
              tStack_58.data.size = (size_t)(char *)(sVar14 - lVar19);
              (*telnet->eh)(telnet,&tStack_58,telnet->ud);
            }
            telnet->state = TELNET_STATE_EOL;
          }
        }
        else if (uVar15 == 0xff) {
          if ((char *)(sVar14 - lVar19) != (char *)0x0) {
            tStack_58.type = TELNET_EV_DATA;
            tStack_58.data.buffer = buffer + lVar19;
            tStack_58.data.size = (size_t)(char *)(sVar14 - lVar19);
            (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          }
          telnet->state = TELNET_STATE_IAC;
        }
        break;
      case TELNET_STATE_EOL:
        if (bVar9 != 10) {
          bStack_81 = 0xd;
          tStack_58.type = TELNET_EV_DATA;
          tStack_58.data.buffer = (char *)&bStack_81;
          tStack_58.data.size = 1;
          (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          bStack_81 = buffer[sVar14];
        }
        lVar19 = sVar14 + (bStack_81 == 0);
        goto LAB_0010240e;
      case TELNET_STATE_IAC:
        switch(uVar15) {
        case 0xfa:
          telnet->state = TELNET_STATE_SB;
          break;
        case 0xfb:
          telnet->state = TELNET_STATE_WILL;
          break;
        case 0xfc:
          telnet->state = TELNET_STATE_WONT;
          break;
        case 0xfd:
          telnet->state = TELNET_STATE_DO;
          break;
        case 0xfe:
          telnet->state = TELNET_STATE_DONT;
          break;
        case 0xff:
          tStack_58.type = TELNET_EV_DATA;
          tStack_58.data.buffer = (char *)&bStack_81;
          tStack_58.data.size = 1;
          (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          lVar19 = sVar14 + 1;
          telnet->state = TELNET_STATE_DATA;
          break;
        default:
          tStack_58.type = TELNET_EV_IAC;
          pvVar13 = telnet->ud;
          ptVar17 = &tStack_58;
          tStack_58.iac.cmd = bVar9;
          goto LAB_00102407;
        }
        break;
      default:
        bVar1 = telnet->flags;
        if ((bVar1 & 1) != 0) {
          switch(tVar3) {
          case TELNET_STATE_WILL:
switchD_00101a5a_caseD_3:
            tStack_80.type = TELNET_EV_WILL;
            tStack_80.iac.cmd = bVar9;
            break;
          case TELNET_STATE_WONT:
switchD_00101a5a_caseD_4:
            tStack_80.type = TELNET_EV_WONT;
            tStack_80.iac.cmd = bVar9;
            break;
          case TELNET_STATE_DO:
switchD_00101a5a_caseD_5:
            tStack_80.type = TELNET_EV_DO;
            tStack_80.iac.cmd = bVar9;
            break;
          case TELNET_STATE_DONT:
switchD_00101a5a_caseD_6:
            tStack_80.type = TELNET_EV_DONT;
            tStack_80.iac.cmd = bVar9;
            break;
          default:
            goto switchD_00101a5a_default;
          }
LAB_001023fc:
          pvVar13 = telnet->ud;
          ptVar17 = &tStack_80;
          goto LAB_00102407;
        }
        uVar4 = telnet->q_cnt;
        puVar12 = (uint *)(ulong)uVar4;
        if (puVar12 != (uint *)0x0) {
          in_R8 = (uint *)0x0;
          do {
            if (telnet->q[(long)in_R8].telopt == bVar9) {
              uVar11 = (ushort)telnet->q[(long)in_R8].state << 8;
              goto LAB_00101ba4;
            }
            in_R8 = (uint *)((long)in_R8 + 1);
          } while (puVar12 != in_R8);
        }
        uVar11 = 0;
LAB_00101ba4:
        if (3 < tVar3 - TELNET_STATE_WILL) goto switchD_00101a5a_default;
        in_R8 = &switchD_00101bc8::switchdataD_001041d8;
        bVar18 = (byte)(uVar11 >> 8);
        switch(tVar3) {
        case TELNET_STATE_WILL:
          switch(uVar11 >> 0xc) {
          case 0:
            ptVar5 = telnet->telopts;
            if (ptVar5 != (telnet_telopt_t *)0x0) {
              sVar2 = ptVar5->telopt;
              while (sVar2 != -1) {
                if ((int)sVar2 == uVar15) {
                  if (ptVar5->him == 0xfd) {
                    _set_rfc1143(telnet,bVar9,bVar18 & 0xf,'\x01');
                    acStack_84[0] = -1;
                    acStack_84[1] = -3;
                    goto LAB_001021b0;
                  }
                  break;
                }
                sVar2 = ptVar5[1].telopt;
                ptVar5 = ptVar5 + 1;
              }
            }
            acStack_84[0] = -1;
            acStack_84[1] = -2;
LAB_00102316:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar9;
            goto LAB_001023fc;
          default:
            goto switchD_00101a5a_default;
          case 2:
            bVar18 = bVar18 & 0xf;
            if (puVar12 != (uint *)0x0) {
              puVar16 = (uint *)0x0;
              do {
                if (telnet->q[(long)puVar16].telopt == bVar9) {
                  telnet->q[(long)puVar16].state = bVar18;
                  if (bVar9 == 0) {
                    bVar10 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar10 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar10;
                  }
                  goto LAB_00102455;
                }
                puVar16 = (uint *)((long)puVar16 + 1);
              } while (puVar12 != puVar16);
            }
            if (uVar4 < telnet->q_size) {
LAB_00102104:
              ptVar7 = telnet->q;
              uVar15 = telnet->q_cnt;
              ptVar7[uVar15].telopt = bVar9;
              ptVar7[uVar15].state = bVar18;
              telnet->q_cnt = uVar15 + 1;
            }
            else {
              ptVar7 = (telnet_rfc1143_t *)realloc(telnet->q,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar7 != (telnet_rfc1143_t *)0x0) {
                uVar15 = telnet->q_size;
                *(undefined8 *)(ptVar7 + uVar15) = 0;
                telnet->q = ptVar7;
                telnet->q_size = uVar15 + 4;
                goto LAB_00102104;
              }
              piVar8 = __errno_location();
              in_stack_ffffffffffffff68 = strerror(*piVar8);
              _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                     in_stack_ffffffffffffff68);
            }
LAB_00102455:
            tStack_80.type = TELNET_EV_WONT;
            tStack_80.iac.cmd = bVar9;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            uVar15 = 0x195;
            break;
          case 3:
            _set_rfc1143(telnet,bVar9,bVar18 & 0xf,'\x01');
            goto switchD_00101a5a_caseD_3;
          case 4:
            _set_rfc1143(telnet,bVar9,bVar18 & 0xf,'\x01');
            uVar15 = 0x19a;
            break;
          case 5:
            _set_rfc1143(telnet,bVar9,bVar18 & 0xf,'\x02');
            acStack_84[0] = -1;
            acStack_84[1] = -2;
LAB_001021b0:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar9;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            tStack_80.type = TELNET_EV_WILL;
            goto LAB_001023ad;
          }
          func = "_negotiate";
          tVar6 = TELNET_EPROTOCOL;
          fmt = "DONT answered by WILL";
          break;
        case TELNET_STATE_WONT:
          switch(uVar11 >> 0xc) {
          case 1:
            bVar18 = bVar18 & 0xf;
            if (puVar12 != (uint *)0x0) {
              puVar16 = (uint *)0x0;
              do {
                if (telnet->q[(long)puVar16].telopt == bVar9) {
                  telnet->q[(long)puVar16].state = bVar18;
                  if (bVar9 == 0) {
                    bVar10 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar10 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar10;
                  }
                  goto LAB_0010236d;
                }
                puVar16 = (uint *)((long)puVar16 + 1);
              } while (puVar12 != puVar16);
            }
            if (uVar4 < telnet->q_size) {
LAB_00101fc2:
              ptVar7 = telnet->q;
              uVar15 = telnet->q_cnt;
              ptVar7[uVar15].telopt = bVar9;
              ptVar7[uVar15].state = bVar18;
              telnet->q_cnt = uVar15 + 1;
            }
            else {
              ptVar7 = (telnet_rfc1143_t *)realloc(telnet->q,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar7 != (telnet_rfc1143_t *)0x0) {
                uVar15 = telnet->q_size;
                *(undefined8 *)(ptVar7 + uVar15) = 0;
                telnet->q = ptVar7;
                telnet->q_size = uVar15 + 4;
                goto LAB_00101fc2;
              }
              piVar8 = __errno_location();
              in_stack_ffffffffffffff68 = strerror(*piVar8);
              _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                     in_stack_ffffffffffffff68);
            }
LAB_0010236d:
            acStack_84[0] = -1;
            acStack_84[1] = -2;
            goto LAB_00102374;
          case 2:
            bVar18 = bVar18 & 0xf;
            if (puVar12 != (uint *)0x0) {
              puVar16 = (uint *)0x0;
              do {
                if (telnet->q[(long)puVar16].telopt == bVar9) {
                  telnet->q[(long)puVar16].state = bVar18;
                  if (bVar9 == 0) {
                    bVar10 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar10 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar10;
                  }
                  goto switchD_00101a5a_caseD_4;
                }
                puVar16 = (uint *)((long)puVar16 + 1);
              } while (puVar12 != puVar16);
            }
            if (telnet->q_size <= uVar4) {
              ptVar7 = (telnet_rfc1143_t *)realloc(telnet->q,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar7 == (telnet_rfc1143_t *)0x0) {
                piVar8 = __errno_location();
                in_stack_ffffffffffffff68 = strerror(*piVar8);
                _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                       in_stack_ffffffffffffff68);
                goto switchD_00101a5a_caseD_4;
              }
              uVar15 = telnet->q_size;
              *(undefined8 *)(ptVar7 + uVar15) = 0;
              telnet->q = ptVar7;
              telnet->q_size = uVar15 + 4;
            }
            ptVar7 = telnet->q;
            uVar15 = telnet->q_cnt;
            ptVar7[uVar15].telopt = bVar9;
            ptVar7[uVar15].state = bVar18;
            telnet->q_cnt = uVar15 + 1;
            goto switchD_00101a5a_caseD_4;
          case 3:
          case 5:
            bVar18 = bVar18 & 0xf;
            if (puVar12 != (uint *)0x0) {
              puVar16 = (uint *)0x0;
              do {
                if (telnet->q[(long)puVar16].telopt == bVar9) {
                  telnet->q[(long)puVar16].state = bVar18;
                  if (bVar9 == 0) {
                    bVar9 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar9 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar9;
                  }
                  goto switchD_00101a5a_default;
                }
                puVar16 = (uint *)((long)puVar16 + 1);
              } while (puVar12 != puVar16);
            }
            if (telnet->q_size <= uVar4) {
              ptVar7 = (telnet_rfc1143_t *)realloc(telnet->q,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar7 == (telnet_rfc1143_t *)0x0) {
                piVar8 = __errno_location();
                in_stack_ffffffffffffff68 = strerror(*piVar8);
                uVar15 = 0x151;
                func = "_set_rfc1143";
                tVar6 = TELNET_ENOMEM;
                fmt = "realloc() failed: %s";
                goto LAB_0010248b;
              }
              uVar15 = telnet->q_size;
              *(undefined8 *)(ptVar7 + uVar15) = 0;
              telnet->q = ptVar7;
              telnet->q_size = uVar15 + 4;
            }
            ptVar7 = telnet->q;
            uVar15 = telnet->q_cnt;
            ptVar7[uVar15].telopt = bVar9;
            ptVar7[uVar15].state = bVar18;
            telnet->q_cnt = uVar15 + 1;
            break;
          case 4:
            _set_rfc1143(telnet,bVar9,bVar18 & 0xf,'\x03');
            acStack_84[0] = -1;
            acStack_84[1] = -3;
LAB_00102374:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar9;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            tStack_80.type = TELNET_EV_WONT;
LAB_001023ad:
            ptVar17 = &tStack_80;
            pvVar13 = telnet->ud;
            tStack_80.iac.cmd = bVar9;
LAB_00102407:
            (*telnet->eh)(telnet,ptVar17,pvVar13);
          }
          goto switchD_00101a5a_default;
        case TELNET_STATE_DO:
          switch(uVar11 >> 8 & 0xf) {
          case 0:
            ptVar5 = telnet->telopts;
            if (ptVar5 != (telnet_telopt_t *)0x0) {
              sVar2 = ptVar5->telopt;
              while (sVar2 != -1) {
                if ((int)sVar2 == uVar15) {
                  if (ptVar5->us == 0xfb) {
                    _set_rfc1143(telnet,bVar9,'\x01',bVar18 >> 4);
                    acStack_84[0] = -1;
                    acStack_84[1] = -5;
                    goto LAB_00102136;
                  }
                  break;
                }
                sVar2 = ptVar5[1].telopt;
                ptVar5 = ptVar5 + 1;
              }
            }
            acStack_84[0] = -1;
            acStack_84[1] = -4;
            goto LAB_00102316;
          default:
            goto switchD_00101a5a_default;
          case 2:
            _set_rfc1143(telnet,bVar9,'\0',bVar18 >> 4);
            tStack_80.type = TELNET_EV_DONT;
            tStack_80.iac.cmd = bVar9;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            uVar15 = 0x1cf;
            break;
          case 3:
            _set_rfc1143(telnet,bVar9,'\x01',bVar18 >> 4);
            goto switchD_00101a5a_caseD_5;
          case 4:
            _set_rfc1143(telnet,bVar9,'\x01',bVar18 >> 4);
            uVar15 = 0x1d4;
            break;
          case 5:
            _set_rfc1143(telnet,bVar9,'\x02',bVar18 >> 4);
            acStack_84[0] = -1;
            acStack_84[1] = -4;
LAB_00102136:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar9;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            tStack_80.type = TELNET_EV_DO;
            goto LAB_001023ad;
          }
          func = "_negotiate";
          tVar6 = TELNET_EPROTOCOL;
          fmt = "WONT answered by DO";
          break;
        case TELNET_STATE_DONT:
          switch(uVar11 >> 8 & 0xf) {
          case 1:
            _set_rfc1143(telnet,bVar9,'\0',bVar18 >> 4);
            acStack_84[0] = -1;
            acStack_84[1] = -4;
            goto LAB_00101edc;
          case 2:
            _set_rfc1143(telnet,bVar9,'\0',bVar18 >> 4);
            goto switchD_00101a5a_caseD_6;
          case 3:
          case 5:
            _set_rfc1143(telnet,bVar9,'\0',bVar18 >> 4);
            break;
          case 4:
            _set_rfc1143(telnet,bVar9,'\x03',bVar18 >> 4);
            acStack_84[0] = -1;
            acStack_84[1] = -5;
LAB_00101edc:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar9;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            tStack_80.type = TELNET_EV_DONT;
            goto LAB_001023ad;
          }
          goto switchD_00101a5a_default;
        }
LAB_0010248b:
        _error(telnet,uVar15,func,tVar6,(int)in_R8,fmt);
switchD_00101a5a_default:
        lVar19 = sVar14 + 1;
LAB_0010240e:
        telnet->state = TELNET_STATE_DATA;
        break;
      case TELNET_STATE_SB:
        telnet->sb_telopt = bVar9;
        telnet->buffer_pos = 0;
LAB_00101ad0:
        telnet->state = TELNET_STATE_SB_DATA;
        break;
      case TELNET_STATE_SB_DATA:
        if (bVar9 == 0xff) {
          telnet->state = TELNET_STATE_SB_DATA_IAC;
        }
        else {
          if (bVar9 == 0xfb && telnet->sb_telopt == 'U') {
            lVar19 = sVar14 + 2;
            goto LAB_0010240e;
          }
          tVar6 = _buffer_byte(telnet,bVar9);
          if (tVar6 != TELNET_EOK) goto switchD_00101a5a_default;
        }
        break;
      case TELNET_STATE_SB_DATA_IAC:
        if (bVar9 == 0xff) {
          tVar6 = _buffer_byte(telnet,0xff);
          if (tVar6 != TELNET_EOK) goto switchD_00101a5a_default;
          goto LAB_00101ad0;
        }
        if (bVar9 == 0xf0) {
          lVar19 = sVar14 + 1;
          telnet->state = TELNET_STATE_DATA;
          _subnegotiate(telnet);
        }
        else {
          in_stack_ffffffffffffff68 =
               (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),uVar15);
          _error(telnet,0x472,"_process",TELNET_EPROTOCOL,(int)in_R8,
                 "unexpected byte after IAC inside SB: %d",in_stack_ffffffffffffff68);
          telnet->state = TELNET_STATE_IAC;
          _subnegotiate(telnet);
          lVar19 = sVar14 + 1;
          _process(telnet,(char *)&bStack_81,1);
        }
      }
LAB_00102415:
      sVar14 = sVar14 + 1;
    } while (sVar14 != size);
  }
  if ((telnet->state == TELNET_STATE_DATA) &&
     (tStack_58.error.func = (char *)(size - lVar19), (char *)tStack_58.data.size != (char *)0x0)) {
    tStack_58.type = TELNET_EV_DATA;
    tStack_58.data.buffer = buffer + lVar19;
    (*telnet->eh)(telnet,&tStack_58,telnet->ud);
  }
  return;
}

Assistant:

void telnet_recv(telnet_t *telnet, const char *buffer,
		size_t size) {
#if defined(HAVE_ZLIB)
	/* if we have an inflate (decompression) zlib stream, use it */
	if (telnet->z != 0 && !(telnet->flags & TELNET_PFLAG_DEFLATE)) {
		char inflate_buffer[1024];
		int rs;

		/* initialize zlib state */
		telnet->z->next_in = (unsigned char*)buffer;
		telnet->z->avail_in = (unsigned int)size;
		telnet->z->next_out = (unsigned char *)inflate_buffer;
		telnet->z->avail_out = sizeof(inflate_buffer);

		/* inflate until buffer exhausted and all output is produced */
		while (telnet->z->avail_in > 0 || telnet->z->avail_out == 0) {
			/* reset output buffer */

			/* decompress */
			rs = inflate(telnet->z, Z_SYNC_FLUSH);

			/* process the decompressed bytes on success */
			if (rs == Z_OK || rs == Z_STREAM_END)
				_process(telnet, inflate_buffer, sizeof(inflate_buffer) -
						telnet->z->avail_out);
			else
				_error(telnet, __LINE__, __func__, TELNET_ECOMPRESS, 1,
						"inflate() failed: %s", zError(rs));

			/* prepare output buffer for next run */
			telnet->z->next_out = (unsigned char *)inflate_buffer;
			telnet->z->avail_out = sizeof(inflate_buffer);

			/* on error (or on end of stream) disable further inflation */
			if (rs != Z_OK) {
				telnet_event_t ev;

				/* disable compression */
				inflateEnd(telnet->z);
				free(telnet->z);
				telnet->z = 0;

				/* send event */
				ev.type = TELNET_EV_COMPRESS;
				ev.compress.state = 0;
				telnet->eh(telnet, &ev, telnet->ud);

				break;
			}
		}

	/* COMPRESS2 is not negotiated, just process */
	} else
#endif /* defined(HAVE_ZLIB) */
		_process(telnet, buffer, size);
}